

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O0

int __thiscall
SatPos::CalculateSatVel
          (SatPos *this,long *Eph,int flag,undefined8 param_4,undefined8 param_5,undefined8 param_6)

{
  XYZ *pXVar1;
  double dVar2;
  Matrix<double,_3,_1> MVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  byte bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  Matrix<double,_3,_1> MVar19;
  undefined8 auStack_2920 [599];
  double *local_1668;
  double *local_1660;
  double *local_1658;
  undefined8 *local_1650;
  SatPos *local_1648;
  int local_163c;
  double *local_1638;
  double *local_1628;
  double *local_1620;
  double *local_1618;
  double *local_1610;
  Matrix<double,_3,_1> local_1608;
  double *local_15f8;
  double local_15f0;
  double *local_15e8;
  double local_15e0;
  double *local_15d8;
  double local_15d0;
  double *local_15c8;
  double local_15c0;
  double local_15b8;
  double *local_15b0;
  double *local_15a8;
  double local_15a0;
  double *local_1598;
  double *local_1590;
  double local_1588;
  double local_1580;
  double local_1578;
  double *local_1570;
  double local_1568;
  double local_1560;
  double local_1558;
  double local_1550;
  double local_1548;
  double *local_1540;
  double local_1538;
  double local_1530;
  double *local_1528;
  double local_1520;
  double *local_1518;
  double local_1510;
  double local_1508;
  double local_1500;
  double *local_14f8;
  double local_14f0;
  double local_14e8;
  double local_14e0;
  double local_14d8;
  double local_14d0;
  double *local_14c8;
  double local_14c0;
  double local_14b8;
  double *local_14b0;
  double local_14a8;
  double *local_14a0;
  double local_1498;
  double local_1490;
  double local_1488;
  double local_1480;
  double local_1478;
  double local_1470;
  double local_1468;
  double local_1460;
  double local_1458;
  double local_1450;
  double local_1448;
  double local_1440;
  double local_1438;
  double local_1430;
  double local_1428;
  double local_1420;
  double local_1418;
  double local_1410;
  double local_1408;
  double local_1400;
  double local_13f8;
  undefined1 *local_13f0;
  SatPos *local_13e8;
  undefined8 local_13e0 [599];
  Matrix<double,_3,_1> local_128;
  double local_118;
  double dStack_110;
  double local_108;
  undefined1 auStack_f8 [8];
  Vector3d velocity;
  Matrix<double,_4,_1> p;
  undefined1 local_c8 [8];
  Matrix<double,_3,_4> Rdot;
  double ik;
  double Omegak;
  double YKdot;
  double XKdot;
  double YK;
  double XK;
  double Omegakdot;
  double Ikdot;
  double rkdot;
  double ukdot;
  double Phikdot;
  double right;
  double left;
  double Ekdot;
  double phik;
  SatPos *pSStack_38;
  int prn;
  Satellite *param;
  double RotationRate;
  int maxprn;
  NavSys flag_local;
  Ephemeris **Eph_local;
  SatPos *this_local;
  
  bVar7 = 0;
  local_13f0 = &stack0x00000008;
  if (flag == 0) {
    RotationRate._0_4_ = 0x20;
    param = (Satellite *)0x3f131da7d7cb8d5b;
    pSStack_38 = this;
  }
  else {
    if (flag != 4) {
      return -2;
    }
    RotationRate._0_4_ = 0x40;
    param = (Satellite *)0x3f131da7d157db65;
    pSStack_38 = (SatPos *)this->Bds;
  }
  local_13e8 = this;
  for (phik._4_4_ = 0; phik._4_4_ < RotationRate._0_4_; phik._4_4_ = phik._4_4_ + 1) {
    dVar2 = pSStack_38->Gps[phik._4_4_].n;
    if ((dVar2 != -1.0) || (NAN(dVar2))) {
      dVar2 = pSStack_38->Gps[phik._4_4_].phik;
      local_13f8 = pSStack_38->Gps[phik._4_4_].n;
      local_1400 = *(double *)(*Eph + (long)phik._4_4_ * 0xd8 + 0x30);
      dVar8 = cos(pSStack_38->Gps[phik._4_4_].Ek);
      dVar8 = local_13f8 / (-local_1400 * dVar8 + 1.0);
      if (flag == 0) {
        local_13e8->Gps[phik._4_4_].Ekdot = dVar8;
      }
      if (flag == 4) {
        local_13e8->Bds[phik._4_4_].Ekdot = dVar8;
      }
      dVar9 = sqrt((*(double *)(*Eph + (long)phik._4_4_ * 0xd8 + 0x30) + 1.0) /
                   (1.0 - *(double *)(*Eph + (long)phik._4_4_ * 0xd8 + 0x30)));
      local_1458 = cos(pSStack_38->Gps[phik._4_4_].vk / 2.0);
      dVar10 = cos(pSStack_38->Gps[phik._4_4_].Ek / 2.0);
      dVar9 = dVar9 * (local_1458 / dVar10) * (local_1458 / dVar10) * dVar8;
      local_1440 = *(double *)(*Eph + (long)phik._4_4_ * 0xd8 + 0x50);
      local_1448 = cos(dVar2 * 2.0);
      local_1450 = *(double *)(*Eph + (long)phik._4_4_ * 0xd8 + 0x48);
      dVar10 = sin(dVar2 * 2.0);
      dVar10 = (local_1440 * local_1448 + -(local_1450 * dVar10)) * 2.0 * dVar9 + dVar9;
      local_1438 = *(double *)(*Eph + (long)phik._4_4_ * 0xd8 + 0x38) *
                   *(double *)(*Eph + (long)phik._4_4_ * 0xd8 + 0x38) *
                   *(double *)(*Eph + (long)phik._4_4_ * 0xd8 + 0x30);
      dVar11 = sin(pSStack_38->Gps[phik._4_4_].Ek);
      dVar11 = local_1438 * dVar11;
      local_1430 = *(double *)(*Eph + (long)phik._4_4_ * 0xd8 + 0x60);
      local_1428 = cos(dVar2 * 2.0);
      local_1420 = *(double *)(*Eph + (long)phik._4_4_ * 0xd8 + 0x58);
      dVar12 = sin(dVar2 * 2.0);
      dVar8 = (local_1430 * local_1428 + -(local_1420 * dVar12)) * 2.0 * dVar9 + dVar11 * dVar8;
      local_1418 = *(double *)(*Eph + (long)phik._4_4_ * 0xd8 + 0x70);
      local_1410 = cos(dVar2 * 2.0);
      local_1408 = *(double *)(*Eph + (long)phik._4_4_ * 0xd8 + 0x68);
      dVar11 = sin(dVar2 * 2.0);
      dVar11 = local_1408 * dVar11;
      dVar12 = local_1418 * local_1410;
      dVar2 = *(double *)(*Eph + (long)phik._4_4_ * 0xd8 + 0x80);
      XK = *(double *)(*Eph + (long)phik._4_4_ * 0xd8 + 0x90) - (double)param;
      if ((flag == 4) && ((phik._4_4_ < 5 || (0x39 < phik._4_4_)))) {
        XK = *(double *)(*Eph + (long)phik._4_4_ * 0xd8 + 0x90);
      }
      local_1498 = pSStack_38->Gps[phik._4_4_].rk;
      dVar13 = cos(pSStack_38->Gps[phik._4_4_].uk);
      dVar13 = local_1498 * dVar13;
      local_1490 = pSStack_38->Gps[phik._4_4_].rk;
      dVar14 = sin(pSStack_38->Gps[phik._4_4_].uk);
      dVar14 = local_1490 * dVar14;
      local_1478 = dVar8;
      local_1480 = cos(pSStack_38->Gps[phik._4_4_].uk);
      local_1488 = pSStack_38->Gps[phik._4_4_].rk * dVar10;
      dVar15 = sin(pSStack_38->Gps[phik._4_4_].uk);
      dVar15 = local_1488 * dVar15;
      dVar16 = local_1478 * local_1480;
      local_1460 = dVar8;
      local_1468 = sin(pSStack_38->Gps[phik._4_4_].uk);
      local_1470 = pSStack_38->Gps[phik._4_4_].rk * dVar10;
      dVar10 = cos(pSStack_38->Gps[phik._4_4_].uk);
      dVar10 = local_1470 * dVar10;
      dVar17 = local_1460 * local_1468;
      dVar8 = pSStack_38->Gps[phik._4_4_].Omegak;
      Rdot.data = (double *)pSStack_38->Gps[phik._4_4_].ik;
      Matrix<double,_3,_4>::Matrix((Matrix<double,_3,_4> *)local_c8);
      local_14a8 = cos(dVar8);
      local_14a0 = Matrix<double,_3,_4>::operator()((Matrix<double,_3,_4> *)local_c8,0,0);
      *local_14a0 = local_14a8;
      local_14c0 = sin(dVar8);
      local_14c0 = -local_14c0;
      local_14b8 = cos((double)Rdot.data);
      local_14b8 = local_14c0 * local_14b8;
      local_14b0 = Matrix<double,_3,_4>::operator()((Matrix<double,_3,_4> *)local_c8,0,1);
      *local_14b0 = local_14b8;
      local_14d8 = dVar13;
      local_14e0 = sin(dVar8);
      local_14f0 = dVar14;
      local_14e8 = cos(dVar8);
      local_14e8 = local_14f0 * local_14e8;
      dVar18 = cos((double)Rdot.data);
      local_14d0 = -(local_14d8 * local_14e0 + local_14e8 * dVar18);
      local_14c8 = Matrix<double,_3,_4>::operator()((Matrix<double,_3,_4> *)local_c8,0,2);
      *local_14c8 = local_14d0;
      local_1510 = dVar14;
      local_1508 = sin(dVar8);
      local_1508 = local_1510 * local_1508;
      local_1500 = sin((double)Rdot.data);
      local_1500 = local_1508 * local_1500;
      local_14f8 = Matrix<double,_3,_4>::operator()((Matrix<double,_3,_4> *)local_c8,0,3);
      *local_14f8 = local_1500;
      local_1520 = sin(dVar8);
      local_1518 = Matrix<double,_3,_4>::operator()((Matrix<double,_3,_4> *)local_c8,1,0);
      *local_1518 = local_1520;
      local_1538 = cos(dVar8);
      local_1530 = cos((double)Rdot.data);
      local_1530 = local_1538 * local_1530;
      local_1528 = Matrix<double,_3,_4>::operator()((Matrix<double,_3,_4> *)local_c8,1,1);
      *local_1528 = local_1530;
      local_1550 = dVar13;
      local_1558 = cos(dVar8);
      local_1568 = dVar14;
      local_1560 = sin(dVar8);
      local_1560 = local_1568 * local_1560;
      dVar13 = cos((double)Rdot.data);
      local_1548 = local_1550 * local_1558 - local_1560 * dVar13;
      local_1540 = Matrix<double,_3,_4>::operator()((Matrix<double,_3,_4> *)local_c8,1,2);
      *local_1540 = local_1548;
      local_1588 = dVar14;
      local_1580 = cos(dVar8);
      local_1580 = local_1588 * local_1580;
      local_1578 = sin((double)Rdot.data);
      local_1578 = local_1580 * local_1578;
      local_1570 = Matrix<double,_3,_4>::operator()((Matrix<double,_3,_4> *)local_c8,1,3);
      *local_1570 = local_1578;
      local_1590 = Matrix<double,_3,_4>::operator()((Matrix<double,_3,_4> *)local_c8,2,0);
      *local_1590 = 0.0;
      local_15a0 = sin((double)Rdot.data);
      local_1598 = Matrix<double,_3,_4>::operator()((Matrix<double,_3,_4> *)local_c8,2,1);
      *local_1598 = local_15a0;
      local_15a8 = Matrix<double,_3,_4>::operator()((Matrix<double,_3,_4> *)local_c8,2,2);
      *local_15a8 = 0.0;
      local_15c0 = dVar14;
      local_15b8 = cos((double)Rdot.data);
      local_15b8 = local_15c0 * local_15b8;
      local_15b0 = Matrix<double,_3,_4>::operator()((Matrix<double,_3,_4> *)local_c8,2,3);
      *local_15b0 = local_15b8;
      Matrix<double,_4,_1>::Matrix((Matrix<double,_4,_1> *)&velocity.data);
      local_15d0 = dVar16 - dVar15;
      local_15c8 = Matrix<double,_4,_1>::operator()((Matrix<double,_4,_1> *)&velocity.data,0,0);
      *local_15c8 = local_15d0;
      local_15e0 = dVar17 + dVar10;
      local_15d8 = Matrix<double,_4,_1>::operator()((Matrix<double,_4,_1> *)&velocity.data,1,0);
      *local_15d8 = local_15e0;
      local_15f0 = XK;
      local_15e8 = Matrix<double,_4,_1>::operator()((Matrix<double,_4,_1> *)&velocity.data,2,0);
      *local_15e8 = local_15f0;
      local_1608.data = (double *)((dVar12 + -dVar11) * 2.0 * dVar9 + dVar2);
      local_15f8 = Matrix<double,_4,_1>::operator()((Matrix<double,_4,_1> *)&velocity.data,3,0);
      *local_15f8 = (double)local_1608.data;
      MVar19 = Matrix<double,3,4>::operator*
                         ((Matrix<double,3,4> *)local_c8,(Matrix<double,_4,_1> *)&velocity.data);
      local_1610 = MVar19.data;
      local_1608._0_8_ = MVar19._0_8_;
      MVar3 = MVar19;
      if (flag == 0) {
        auStack_f8 = (undefined1  [8])local_1608._0_8_;
        velocity._0_8_ = local_1610;
        local_1618 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)auStack_f8,0,0);
        local_13e8->Gps[phik._4_4_].SatVelocity.X = *local_1618;
        local_1620 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)auStack_f8,1,0);
        local_13e8->Gps[phik._4_4_].SatVelocity.Y = *local_1620;
        local_1628 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)auStack_f8,2,0);
        MVar3.data = (double *)velocity._0_8_;
        MVar3.rows = auStack_f8._0_4_;
        MVar3.cols = auStack_f8._4_4_;
        MVar19.data = local_1610;
        MVar19.rows = local_1608.rows;
        MVar19.cols = local_1608.cols;
        local_13e8->Gps[phik._4_4_].SatVelocity.Z = *local_1628;
      }
      velocity._0_8_ = MVar3.data;
      auStack_f8 = MVar3._0_8_;
      local_1610 = MVar19.data;
      local_1608._0_8_ = MVar19._0_8_;
      if ((flag == 4) && ((phik._4_4_ < 5 || (0x39 < phik._4_4_)))) {
        lVar4 = (long)phik._4_4_;
        local_1648 = (SatPos *)pSStack_38->Gps[lVar4].tk;
        local_108 = local_13e8->Bds[lVar4].GK.Z;
        pXVar1 = &local_13e8->Bds[lVar4].GK;
        local_118 = pXVar1->X;
        dStack_110 = pXVar1->Y;
        local_163c = phik._4_4_;
        local_1650 = local_13e0;
        local_128 = MVar3;
        memcpy(local_1650,local_13f0,0x12b8);
        local_1638 = local_128.data;
        puVar5 = local_1650;
        puVar6 = auStack_2920;
        for (lVar4 = 599; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar6 = *puVar5;
          puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
          puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
        }
        CalculateGEOVel(local_1648,local_13e8,local_163c,local_128._0_8_,local_128.data,local_108,
                        param_6,local_118,dStack_110,local_108);
        MVar3.data = (double *)velocity._0_8_;
        MVar3.rows = auStack_f8._0_4_;
        MVar3.cols = auStack_f8._4_4_;
        MVar19.data = local_1610;
        MVar19.rows = local_1608.rows;
        MVar19.cols = local_1608.cols;
      }
      velocity._0_8_ = MVar3.data;
      auStack_f8 = MVar3._0_8_;
      local_1610 = MVar19.data;
      local_1608._0_8_ = MVar19._0_8_;
      if (((flag == 4) && (4 < phik._4_4_)) && (phik._4_4_ < 0x3a)) {
        local_1658 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)auStack_f8,0,0);
        local_13e8->Bds[phik._4_4_].SatVelocity.X = *local_1658;
        local_1660 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)auStack_f8,1,0);
        local_13e8->Bds[phik._4_4_].SatVelocity.Y = *local_1660;
        local_1668 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)auStack_f8,2,0);
        MVar3.data = (double *)velocity._0_8_;
        MVar3.rows = auStack_f8._0_4_;
        MVar3.cols = auStack_f8._4_4_;
        MVar19.data = local_1610;
        MVar19.rows = local_1608.rows;
        MVar19.cols = local_1608.cols;
        local_13e8->Bds[phik._4_4_].SatVelocity.Z = *local_1668;
      }
      velocity._0_8_ = MVar3.data;
      auStack_f8 = MVar3._0_8_;
      local_1610 = MVar19.data;
      local_1608._0_8_ = MVar19._0_8_;
      Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)auStack_f8);
      Matrix<double,_4,_1>::deleteMatrix((Matrix<double,_4,_1> *)&velocity.data);
      Matrix<double,_3,_4>::deleteMatrix((Matrix<double,_3,_4> *)local_c8);
    }
  }
  return 0;
}

Assistant:

int SatPos::CalculateSatVel(Ephemeris* &&Eph, const NavSys flag, SPPResult result)
{
    int maxprn;
    double RotationRate;
    Satellite* param;

    if(flag == GPS)
    {
        maxprn = MAXGPSSRN;
        RotationRate = GPSROTATIONRATE;
        param = this->Gps;
    }
    else if(flag == BDS)
    {
        maxprn = MAXBDSSRN;
        RotationRate = BDSROTATIONRATE;
        param = this->Bds;
    }
    else
        return UNSUPPORTED_MSG;

    for(int prn = 0; prn < maxprn; ++prn)
    {
        if(param[prn].n == -1)
            continue;

        try
        {   
            // temp
            double phik = param[prn].phik;
            double Ekdot = param[prn].n / (1 - Eph[prn].ecc * cos(param[prn].Ek));
            if(flag == GPS)
                this->Gps[prn].Ekdot = Ekdot;
            if(flag == BDS)
                this->Bds[prn].Ekdot = Ekdot;

            // temp param, to calculate long equation
            double left = sqrt((1 + Eph[prn].ecc) / (1 - Eph[prn].ecc));
            double right = cos(param[prn].vk / 2.0) / cos(param[prn].Ek / 2.0);
            double Phikdot = left * right * right * Ekdot;

            left = Eph[prn].cus * cos(2 * phik) - Eph[prn].cuc * sin(2 * phik);
            double ukdot = 2 * left * Phikdot + Phikdot;

            left = Eph[prn].sqrtA * Eph[prn].sqrtA * Eph[prn].ecc * sin(param[prn].Ek) * Ekdot;
            right = 2 * (Eph[prn].crs * cos(2 * phik) - Eph[prn].crc * sin(2 * phik));
            double rkdot = left + right * Phikdot;

            right = 2 * (Eph[prn].cis * cos(2 * phik) - Eph[prn].cic * sin(2 * phik));
            double Ikdot = Eph[prn].I0Rate + right * Phikdot;

            double Omegakdot = Eph[prn].omegaORate - RotationRate;

            if(flag == BDS && (prn < 5 || prn >= 58))
                Omegakdot = Eph[prn].omegaORate;
            
            double XK = param[prn].rk * cos(param[prn].uk);
            double YK = param[prn].rk * sin(param[prn].uk);
            double XKdot = rkdot * cos(param[prn].uk) - param[prn].rk * ukdot * sin(param[prn].uk);
            double YKdot = rkdot * sin(param[prn].uk) + param[prn].rk * ukdot * cos(param[prn].uk);

            // temp
            double Omegak = param[prn].Omegak;
            double ik = param[prn].ik;

            Matrix<double, 3, 4> Rdot;
            Rdot(0, 0) = cos(Omegak);
            Rdot(0, 1) = -sin(Omegak) * cos(ik);
            Rdot(0, 2) = -(XK * sin(Omegak) + YK * cos(Omegak) * cos(ik));
            Rdot(0, 3) = YK * sin(Omegak) * sin(ik);

            Rdot(1, 0) = sin(Omegak);
            Rdot(1, 1) = cos(Omegak) * cos(ik);
            Rdot(1, 2) = XK * cos(Omegak) - YK * sin(Omegak) * cos(ik);
            Rdot(1, 3) = YK * cos(Omegak) * sin(ik);

            Rdot(2, 0) = 0;
            Rdot(2, 1) = sin(ik);
            Rdot(2, 2) = 0;
            Rdot(2, 3) = YK * cos(ik);
            
            Matrix<double, 4, 1> p;
            p(0, 0) = XKdot;
            p(1, 0) = YKdot;
            p(2, 0) = Omegakdot;
            p(3, 0) = Ikdot;

            Vector3d velocity = Rdot * p;
            if(flag == GPS)
            {
                // 有些累赘  其实可以不用XYZ来存储
                // 可以全部存储为Matrix数据
                Gps[prn].SatVelocity.X = velocity(0, 0);
                Gps[prn].SatVelocity.Y = velocity(1, 0);
                Gps[prn].SatVelocity.Z = velocity(2, 0);
            }
            if(flag == BDS && (prn <5 || prn >= 58))
            {
                CalculateGEOVel(param[prn].tk, Bds[prn].GK, prn, velocity, result);
            }
            if(flag == BDS && (prn >= 5 && prn < 58))
            {
                Bds[prn].SatVelocity.X = velocity(0, 0);
                Bds[prn].SatVelocity.Y = velocity(1, 0);
                Bds[prn].SatVelocity.Z = velocity(2, 0);
            }
            // cout << Bds[prn].SatPosition << endl;

            velocity.deleteMatrix();
            p.deleteMatrix();
            Rdot.deleteMatrix();
        }
        catch(...)
        {
            cout << "error happened when calculate satellite velocity" << endl;
            return UNKNOWN_ERROR;
        }
        
    }
    return 0;
}